

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Gecko::Graph::optimize(Graph *this,uint n)

{
  size_type sVar1;
  ostream *this_00;
  Subgraph *this_01;
  uint in_ESI;
  long in_RDI;
  uint k;
  Subgraph *subgraph;
  ostringstream count;
  byte local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint local_214;
  string local_208 [12];
  uint in_stack_fffffffffffffe04;
  Graph *in_stack_fffffffffffffe08;
  Subgraph *in_stack_fffffffffffffe10;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [52];
  int local_18c;
  ostringstream local_188 [20];
  uint in_stack_fffffffffffffe8c;
  Subgraph *in_stack_fffffffffffffe90;
  uint local_c;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10));
  local_c = in_ESI;
  if (sVar1 < in_ESI) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10));
    local_c = (uint)sVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_18c = (int)std::setw(2);
  this_00 = std::operator<<((ostream *)local_188,(_Setw)local_18c);
  std::ostream::operator<<(this_00,local_c);
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"perm",&local_1e1);
  std::__cxx11::ostringstream::str();
  std::operator+(__lhs,in_stack_fffffffffffffdb0);
  (**(code **)(*(long *)__lhs + 0x30))(__lhs,in_RDI,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  this_01 = (Subgraph *)operator_new(0x508);
  Subgraph::Subgraph(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  local_214 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10));
    local_261 = 0;
    if ((ulong)local_214 <= sVar1 - local_c) {
      local_261 = (**(code **)(**(long **)(in_RDI + 8) + 0x40))();
      local_261 = local_261 ^ 0xff;
    }
    if ((local_261 & 1) == 0) break;
    Subgraph::optimize(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    local_214 = local_214 + 1;
  }
  if (this_01 != (Subgraph *)0x0) {
    Subgraph::~Subgraph(this_01);
    operator_delete(this_01);
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x38))(*(long **)(in_RDI + 8),in_RDI,1);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void
Graph::optimize(uint n)
{
  if (n > perm.size())
    n = uint(perm.size());
  ostringstream count;
  count << setw(2) << n;
  progress->beginphase(this, string("perm") + count.str());
  Subgraph* subgraph = new Subgraph(this, n);
  for (uint k = 0; k <= perm.size() - n && !progress->quit(); k++)
    subgraph->optimize(k);
  delete subgraph;
  progress->endphase(this, true);
}